

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O1

Var BranchBailOutRecord::BailOut(BranchBailOutRecord *bailOutRecord,BOOL cond)

{
  byte bVar1;
  ImplicitCallFlags savedImplicitCallFlags;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  JavascriptCallStackLayout *layout;
  Var pvVar7;
  void *unaff_retaddr;
  
  if (bailOutRecord == (BranchBailOutRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0xb3c,"(bailOutRecord)","bailOutRecord");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  layout = BailOutRecord::GetStackLayout(&bailOutRecord->super_BailOutRecord);
  lVar2 = *(long *)layout;
  if ((bailOutRecord->super_BailOutRecord).bailOutKind == BailOutOnImplicitCalls) {
    ThreadContext::CheckAndResetImplicitCallAccessorFlag
              (*(ThreadContext **)(*(long *)(*(long *)(*(long *)(lVar2 + 8) + 8) + 0x490) + 0x3b8));
  }
  bVar1 = ((bailOutRecord->super_BailOutRecord).globalBailOutRecordTable)->field_0x2c;
  if ((bVar1 & 4) == 0) {
    savedImplicitCallFlags =
         *(ImplicitCallFlags *)
          (*(long *)(*(long *)(*(long *)(*(long *)(lVar2 + 8) + 8) + 0x490) + 0x3b8) + 0x1570);
    if ((bVar1 & 1) != 0) {
      pvVar7 = BailOutInlined(layout,bailOutRecord,cond,unaff_retaddr,savedImplicitCallFlags);
      return pvVar7;
    }
    pvVar7 = BailOutFromFunction(layout,bailOutRecord,cond,unaff_retaddr,(void *)0x0,
                                 savedImplicitCallFlags);
    return pvVar7;
  }
  if ((bVar1 & 1) == 0) {
    uVar5 = BailOutFromLoopBody(layout,bailOutRecord,cond);
  }
  else {
    uVar5 = BailOutFromLoopBodyInlined(layout,bailOutRecord,cond,unaff_retaddr);
  }
  return (Var)(ulong)uVar5;
}

Assistant:

Js::Var BranchBailOutRecord::BailOut(BranchBailOutRecord const * bailOutRecord, BOOL cond)
{
    Assert(bailOutRecord);

    void * argoutRestoreAddr = nullptr;
#ifdef _M_IX86
    void * addressOfRetAddress = _AddressOfReturnAddress();
    if (bailOutRecord->ehBailoutData && (bailOutRecord->ehBailoutData->catchOffset != 0 || bailOutRecord->ehBailoutData->finallyOffset != 0 || bailOutRecord->ehBailoutData->ht == Js::HandlerType::HT_Finally))
    {
        argoutRestoreAddr = (void *)((char*)addressOfRetAddress + ((2 + 1) * MachPtr)); // Account for the parameters and return address of this function
    }
#endif

    Js::JavascriptCallStackLayout *const layout = bailOutRecord->GetStackLayout();
    Js::ScriptFunction * function = (Js::ScriptFunction *)layout->functionObject;

    if (bailOutRecord->bailOutKind == IR::BailOutOnImplicitCalls)
    {
        function->GetScriptContext()->GetThreadContext()->CheckAndResetImplicitCallAccessorFlag();
    }

    Js::ImplicitCallFlags savedImplicitCallFlags = function->GetScriptContext()->GetThreadContext()->GetImplicitCallFlags();

    if(bailOutRecord->globalBailOutRecordTable->isLoopBody)
    {
        if (bailOutRecord->globalBailOutRecordTable->isInlinedFunction)
        {
            return reinterpret_cast<Js::Var>(BailOutFromLoopBodyInlined(layout, bailOutRecord, cond, _ReturnAddress()));
        }
        return reinterpret_cast<Js::Var>(BailOutFromLoopBody(layout, bailOutRecord, cond));
    }
    if(bailOutRecord->globalBailOutRecordTable->isInlinedFunction)
    {
        return BailOutInlined(layout, bailOutRecord, cond, _ReturnAddress(), savedImplicitCallFlags);
    }
    return BailOutFromFunction(layout, bailOutRecord, cond, _ReturnAddress(), argoutRestoreAddr, savedImplicitCallFlags);
}